

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::ByteSizeLong
          (UniDirectionalLSTMLayerParams *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ActivationParams *value;
  size_t sVar4;
  uint64 uVar5;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  UniDirectionalLSTMLayerParams *this_local;
  
  uVar2 = activations_size(this);
  _i = (size_t)uVar2;
  for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
    value = activations(this,local_20);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ActivationParams>(value);
    _i = sVar4 + _i;
  }
  bVar1 = has_params(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::LSTMParams>(this->params_);
    _i = sVar4 + 1 + _i;
  }
  bVar1 = has_weightparams(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::LSTMWeightParams>(this->weightparams_);
    _i = sVar4 + 2 + _i;
  }
  uVar5 = inputvectorsize(this);
  if (uVar5 != 0) {
    uVar5 = inputvectorsize(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    _i = sVar4 + 1 + _i;
  }
  uVar5 = outputvectorsize(this);
  if (uVar5 != 0) {
    uVar5 = outputvectorsize(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    _i = sVar4 + 1 + _i;
  }
  bVar1 = reverseinput(this);
  if (bVar1) {
    _i = _i + 3;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t UniDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  {
    unsigned int count = this->activations_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activations(i));
    }
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->params_);
  }

  // .CoreML.Specification.LSTMWeightParams weightParams = 20;
  if (this->has_weightparams()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weightparams_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}